

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall wasm::HeapType::HeapType(HeapType *this,Array *array)

{
  uintptr_t uVar1;
  undefined8 uVar2;
  HeapType HVar3;
  Array *info;
  undefined8 local_20;
  
  info = array;
  local_20 = operator_new(0x50);
  uVar1 = *(uintptr_t *)&(array->element).packedType;
  (((HeapTypeInfo *)local_20)->field_9).signature.params.id = (array->element).type.id;
  (((HeapTypeInfo *)local_20)->field_9).signature.results.id = uVar1;
  ((HeapTypeInfo *)local_20)->isTemp = false;
  ((HeapTypeInfo *)local_20)->isOpen = false;
  ((HeapTypeInfo *)local_20)->share = Unshared;
  ((HeapTypeInfo *)local_20)->described = (HeapTypeInfo *)0x0;
  ((HeapTypeInfo *)local_20)->recGroup = (RecGroupInfo_conflict *)0x0;
  ((HeapTypeInfo *)local_20)->supertype = (HeapTypeInfo *)0x0;
  ((HeapTypeInfo *)local_20)->descriptor = (HeapTypeInfo *)0x0;
  ((HeapTypeInfo *)local_20)->recGroupIndex = 0;
  ((HeapTypeInfo *)local_20)->kind = Array;
  HVar3 = anon_unknown_0::RecGroupStore::insert
                    ((RecGroupStore *)&stack0xffffffffffffffe0,
                     (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                      *)info);
  uVar2 = local_20;
  this->id = (uintptr_t)HVar3;
  if ((HeapTypeInfo *)local_20 != (HeapTypeInfo *)0x0) {
    anon_unknown_0::HeapTypeInfo::~HeapTypeInfo((HeapTypeInfo *)local_20);
    operator_delete((void *)uVar2,0x50);
    return;
  }
  return;
}

Assistant:

HeapType::HeapType(Array array) {
  new (this)
    HeapType(globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(array)));
}